

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void event_active(event *ev,int res,short ncalls)

{
  void *pvVar1;
  
  if (ev->ev_base == (event_base *)0x0) {
    event_warnx("%s: event has no event_base set.","event_active");
    return;
  }
  pvVar1 = ev->ev_base->th_base_lock;
  if (pvVar1 != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,pvVar1);
  }
  event_debug_assert_is_setup_(ev);
  event_active_nolock_(ev,res,ncalls);
  pvVar1 = ev->ev_base->th_base_lock;
  if (pvVar1 != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,pvVar1);
    return;
  }
  return;
}

Assistant:

void
event_active(struct event *ev, int res, short ncalls)
{
	if (EVUTIL_FAILURE_CHECK(!ev->ev_base)) {
		event_warnx("%s: event has no event_base set.", __func__);
		return;
	}

	EVBASE_ACQUIRE_LOCK(ev->ev_base, th_base_lock);

	event_debug_assert_is_setup_(ev);

	event_active_nolock_(ev, res, ncalls);

	EVBASE_RELEASE_LOCK(ev->ev_base, th_base_lock);
}